

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O3

void __thiscall wasm::PassRunner::PassRunner(PassRunner *this,PassRunner *runner)

{
  MixedArena *pMVar1;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  undefined1 uVar5;
  int iVar6;
  undefined4 uVar7;
  long lVar8;
  PassOptions *pPVar9;
  PassOptions *pPVar10;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
  local_28;
  __alloc_node_gen_t __alloc_node_gen;
  
  this->_vptr_PassRunner = (_func_int **)&PTR__PassRunner_010714e0;
  pMVar1 = runner->allocator;
  this->wasm = runner->wasm;
  this->allocator = pMVar1;
  (this->passes).
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->passes).
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->passes).
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar9 = &runner->options;
  pPVar10 = &this->options;
  for (lVar8 = 8; lVar8 != 0; lVar8 = lVar8 + -1) {
    bVar3 = pPVar9->validate;
    bVar4 = pPVar9->validateGlobally;
    uVar5 = pPVar9->field_0x3;
    iVar6 = pPVar9->optimizeLevel;
    pPVar10->debug = pPVar9->debug;
    pPVar10->validate = bVar3;
    pPVar10->validateGlobally = bVar4;
    pPVar10->field_0x3 = uVar5;
    pPVar10->optimizeLevel = iVar6;
    pPVar9 = (PassOptions *)&pPVar9->shrinkLevel;
    pPVar10 = (PassOptions *)&pPVar10->shrinkLevel;
  }
  (this->options).targetJS = (runner->options).targetJS;
  local_28._M_h = (__hashtable_alloc *)&(this->options).arguments;
  (this->options).arguments._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->options).arguments._M_h._M_bucket_count = (runner->options).arguments._M_h._M_bucket_count;
  (this->options).arguments._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->options).arguments._M_h._M_element_count =
       (runner->options).arguments._M_h._M_element_count;
  uVar7 = *(undefined4 *)&(runner->options).arguments._M_h._M_rehash_policy.field_0x4;
  sVar2 = (runner->options).arguments._M_h._M_rehash_policy._M_next_resize;
  (this->options).arguments._M_h._M_rehash_policy._M_max_load_factor =
       (runner->options).arguments._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->options).arguments._M_h._M_rehash_policy.field_0x4 = uVar7;
  (this->options).arguments._M_h._M_rehash_policy._M_next_resize = sVar2;
  (this->options).arguments._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_28._M_h,&(runner->options).arguments._M_h,&local_28);
  local_28._M_h = (__hashtable_alloc *)&(this->options).passesToSkip;
  (this->options).passesToSkip._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->options).passesToSkip._M_h._M_bucket_count =
       (runner->options).passesToSkip._M_h._M_bucket_count;
  (this->options).passesToSkip._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->options).passesToSkip._M_h._M_element_count =
       (runner->options).passesToSkip._M_h._M_element_count;
  uVar7 = *(undefined4 *)&(runner->options).passesToSkip._M_h._M_rehash_policy.field_0x4;
  sVar2 = (runner->options).passesToSkip._M_h._M_rehash_policy._M_next_resize;
  (this->options).passesToSkip._M_h._M_rehash_policy._M_max_load_factor =
       (runner->options).passesToSkip._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->options).passesToSkip._M_h._M_rehash_policy.field_0x4 = uVar7;
  (this->options).passesToSkip._M_h._M_rehash_policy._M_next_resize = sVar2;
  (this->options).passesToSkip._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_28._M_h,&(runner->options).passesToSkip._M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
              *)&local_28);
  this->isNested = true;
  this->addedPassesRemovedDWARF = false;
  return;
}

Assistant:

explicit PassRunner(const PassRunner* runner)
    : wasm(runner->wasm), allocator(runner->allocator),
      options(runner->options), isNested(true) {}